

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxPrinter.cpp
# Opt level: O3

SyntaxPrinter * __thiscall
slang::syntax::SyntaxPrinter::append(SyntaxPrinter *this,string_view text)

{
  char cVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *__s;
  bool bVar6;
  bool bVar7;
  
  __s = text._M_str;
  uVar5 = text._M_len;
  uVar3 = uVar5;
  if (this->squashNewlines == false) goto LAB_0021b4fe;
  if (uVar5 == 0) {
    uVar3 = 0;
LAB_0021b48f:
    bVar7 = false;
    bVar6 = false;
  }
  else {
    cVar1 = *__s;
    bVar6 = cVar1 == '\r';
    if ((!bVar6) && (cVar1 != '\n')) goto LAB_0021b48f;
    uVar3 = (ulong)(cVar1 == '\r');
    if (uVar3 < uVar5) {
      bVar7 = __s[uVar3] == '\n';
      uVar4 = (ulong)(cVar1 == '\r') + 1;
      if (!bVar7) {
        uVar4 = uVar3;
      }
    }
    else {
      bVar7 = false;
      uVar4 = 1;
    }
    for (; uVar4 < uVar5; uVar4 = uVar4 + 1) {
      if ((__s[uVar4] == '\r') || (__s[uVar4] == '\n')) {
        uVar4 = uVar4 + 1;
      }
    }
    uVar3 = uVar5 - uVar4;
    if (uVar5 < uVar4) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar4,uVar5);
    }
    __s = __s + uVar4;
  }
  sVar2 = (this->buffer)._M_string_length;
  if ((sVar2 == 0) || ((this->buffer)._M_dataplus._M_p[sVar2 - 1] != '\n')) {
    if (bVar6) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&this->buffer,'\r');
    }
    if (bVar7) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&this->buffer,'\n');
    }
  }
LAB_0021b4fe:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&this->buffer,__s,uVar3);
  return this;
}

Assistant:

SyntaxPrinter& SyntaxPrinter::append(std::string_view text) {
    if (!squashNewlines) {
        buffer.append(text);
        return *this;
    }

    bool carriage = false;
    bool newline = false;

    if (!text.empty() && (text[0] == '\r' || text[0] == '\n')) {
        size_t i = 0;
        if (text[i] == '\r') {
            carriage = true;
            i++;
        }

        if (i < text.length() && text[i] == '\n') {
            newline = true;
            i++;
        }

        for (; i < text.length(); i++) {
            if (text[i] == '\r' || text[i] == '\n')
                i++;
        }

        text = text.substr(i);
    }

    if (buffer.empty() || buffer.back() != '\n') {
        if (carriage)
            buffer.push_back('\r');
        if (newline)
            buffer.push_back('\n');
    }

    buffer.append(text);
    return *this;
}